

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkers.cpp
# Opt level: O0

bool make_kinged_proc(Am_Object *self)

{
  Am_Value *pAVar1;
  Am_Object local_50;
  undefined4 local_44;
  Am_Object local_40;
  undefined1 local_35;
  bool black_player;
  int local_24;
  int rank;
  Am_Object piece;
  Am_Object *self_local;
  
  piece.data = (Am_Object_Data *)self;
  Am_Object::Get_Owner((Am_Object *)&stack0xffffffffffffffe0,(Am_Slot_Flags)self);
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)(Am_Object *)&stack0xffffffffffffffe0,0x85);
  local_24 = Am_Value::operator_cast_to_int(pAVar1);
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)&stack0xffffffffffffffe0,(ulong)BLACK_PLAYER);
  local_35 = Am_Value::operator_cast_to_bool(pAVar1);
  if ((bool)local_35) {
    Am_Object::Get_Object((ushort)&local_40,0x110320);
    pAVar1 = (Am_Value *)Am_Object::Get((ushort)&local_40,(ulong)KINGED);
    self_local._7_1_ = Am_Value::operator_cast_to_bool(pAVar1);
    Am_Object::~Am_Object(&local_40);
  }
  else {
    Am_Object::Get_Object((ushort)&local_50,0x110318);
    pAVar1 = (Am_Value *)Am_Object::Get((ushort)&local_50,(ulong)KINGED);
    self_local._7_1_ = Am_Value::operator_cast_to_bool(pAVar1);
    Am_Object::~Am_Object(&local_50);
  }
  local_44 = 1;
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffe0);
  return self_local._7_1_;
}

Assistant:

Am_Define_Formula(bool, make_kinged)
{
  Am_Object piece = self.Get_Owner();
  int rank = piece.Get(Am_RANK);
  bool black_player = piece.Get(BLACK_PLAYER);
  if (black_player)
    return (bool)Black_Pieces.Get_Object(piece_slot[rank]).Get(KINGED);
  else
    return (bool)Red_Pieces.Get_Object(piece_slot[rank]).Get(KINGED);
}